

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TArray<FPlayerClass,_FPlayerClass>::Grow(TArray<FPlayerClass,_FPlayerClass> *this,uint amount)

{
  uint local_30;
  uint local_2c;
  uint choiceb;
  uint choicea;
  uint amount_local;
  TArray<FPlayerClass,_FPlayerClass> *this_local;
  
  if (this->Most < this->Count + amount) {
    local_30 = this->Count + amount;
    if (this->Most < 0x10) {
      local_2c = 0x10;
    }
    else {
      local_2c = this->Most + (this->Most >> 1);
    }
    this->Most = local_2c;
    if (local_30 <= local_2c) {
      local_30 = local_2c;
    }
    this->Most = local_30;
    DoResize(this);
  }
  return;
}

Assistant:

void Grow (unsigned int amount)
	{
		if (Count + amount > Most)
		{
			const unsigned int choicea = Count + amount;
			const unsigned int choiceb = Most = (Most >= 16) ? Most + Most / 2 : 16;
			Most = (choicea > choiceb ? choicea : choiceb);
			DoResize ();
		}
	}